

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

void __thiscall tcu::Matrix<tcu::Interval,_3,_2>::Matrix(Matrix<tcu::Interval,_3,_2> *this)

{
  bool *pbVar1;
  bool bVar2;
  long lVar3;
  Vector<tcu::Interval,_3> *pVVar4;
  long lVar5;
  undefined8 *puVar6;
  bool bVar7;
  uint uVar8;
  undefined1 auStack_50 [8];
  undefined8 local_48 [9];
  
  lVar3 = 0;
  pVVar4 = (Vector<tcu::Interval,_3> *)this;
  do {
    lVar5 = 8;
    do {
      *(undefined1 *)
       ((long)((Vector<tcu::Vector<tcu::Interval,_3>,_2> *)pVVar4->m_data)->m_data[0].m_data +
       lVar5 + -8) = 0;
      pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_3>,_2> *)pVVar4->m_data)->m_data[0].m_data[0].
                m_hasNaN + lVar5;
      *(undefined8 *)pbVar1 = 0x7ff0000000000000;
      *(double *)(pbVar1 + 8) = -INFINITY;
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x50);
    lVar5 = 8;
    do {
      *(undefined1 *)
       ((long)((Vector<tcu::Vector<tcu::Interval,_3>,_2> *)pVVar4->m_data)->m_data[0].m_data +
       lVar5 + -8) = 0;
      pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_3>,_2> *)pVVar4->m_data)->m_data[0].m_data[0].
                m_hasNaN + lVar5;
      *(undefined8 *)pbVar1 = 0x7ff0000000000000;
      *(double *)(pbVar1 + 8) = -INFINITY;
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x50);
    lVar3 = lVar3 + 0x48;
    pVVar4 = pVVar4 + 1;
  } while (lVar3 != 0x90);
  lVar3 = 0;
  bVar2 = true;
  do {
    bVar7 = bVar2;
    lVar5 = 8;
    do {
      auStack_50[lVar5] = 0;
      *(undefined8 *)((long)local_48 + lVar5) = 0x7ff0000000000000;
      *(undefined8 *)((long)local_48 + lVar5 + 8) = 0xfff0000000000000;
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x50);
    lVar5 = 8;
    do {
      auStack_50[lVar5] = 0;
      *(undefined8 *)((long)local_48 + lVar5) = 0x7ff0000000000000;
      *(undefined8 *)((long)local_48 + lVar5 + 8) = 0xfff0000000000000;
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x50);
    puVar6 = local_48;
    pVVar4 = (this->m_data).m_data + lVar3;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      *(undefined8 *)pVVar4->m_data = *puVar6;
      puVar6 = puVar6 + 1;
      pVVar4 = (Vector<tcu::Interval,_3> *)&pVVar4->m_data[0].m_lo;
    }
    lVar3 = 1;
    bVar2 = false;
  } while (bVar7);
  lVar3 = 0;
  do {
    uVar8 = 0x3ff00000;
    if (lVar3 != 0) {
      uVar8 = 0;
    }
    (&(this->m_data).m_data[0].m_data[0].m_hasNaN)[lVar3] = false;
    *(ulong *)((long)&(this->m_data).m_data[0].m_data[0].m_lo + lVar3) = (ulong)uVar8 << 0x20;
    *(ulong *)((long)&(this->m_data).m_data[0].m_data[0].m_hi + lVar3) = (ulong)uVar8 << 0x20;
    uVar8 = 0x3ff00000;
    if (lVar3 != 0x18) {
      uVar8 = 0;
    }
    (&(this->m_data).m_data[1].m_data[0].m_hasNaN)[lVar3] = false;
    *(ulong *)((long)&(this->m_data).m_data[1].m_data[0].m_lo + lVar3) = (ulong)uVar8 << 0x20;
    *(ulong *)((long)&(this->m_data).m_data[1].m_data[0].m_hi + lVar3) = (ulong)uVar8 << 0x20;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x48);
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (void)
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = (row == col) ? T(1) : T(0);
}